

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

void __thiscall sf::Font::setSmooth(Font *this,bool smooth)

{
  byte bVar1;
  bool bVar2;
  iterator iVar3;
  iterator this_00;
  byte in_SIL;
  map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  *in_RDI;
  iterator page;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  if (bVar1 != ((byte)(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count & 1)) {
    *(byte *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = bVar1;
    iVar3 = std::
            map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
            ::begin(in_RDI);
    while( true ) {
      this_00 = std::
                map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
                ::end(in_RDI);
      bVar2 = std::operator!=((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xffffffffffffffe0);
      if (!bVar2) break;
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_sf::Font::Page>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_sf::Font::Page>_> *)0x1dff8d);
      Texture::setSmooth((Texture *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                         SUB81((ulong)iVar3._M_node >> 0x38,0));
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_sf::Font::Page>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_sf::Font::Page>_> *)
                 this_00._M_node);
    }
  }
  return;
}

Assistant:

void Font::setSmooth(bool smooth)
{
    if (smooth != m_isSmooth)
    {
        m_isSmooth = smooth;

        for (sf::Font::PageTable::iterator page = m_pages.begin(); page != m_pages.end(); ++page)
        {
            page->second.texture.setSmooth(m_isSmooth);
        }
    }
}